

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O1

int If_CutFilter(If_Set_t *pCutSet,If_Cut_t *pCut,int fSaveCut0)

{
  uint uVar1;
  uint uVar2;
  If_Cut_t *pIVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  short sVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (pCutSet->ppCuts[pCutSet->nCuts] != pCut) {
    __assert_fail("pCutSet->ppCuts[pCutSet->nCuts] == pCut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCut.c"
                  ,0x96,"int If_CutFilter(If_Set_t *, If_Cut_t *, int)");
  }
  iVar4 = (int)pCutSet->nCuts;
  if (0 < pCutSet->nCuts) {
    iVar5 = 0;
    iVar8 = iVar4;
    do {
      lVar10 = (long)iVar5;
      pIVar3 = pCutSet->ppCuts[lVar10];
      uVar1 = *(uint *)&pIVar3->field_0x1c;
      uVar6 = uVar1 >> 0x18;
      uVar2 = *(uint *)&pCut->field_0x1c;
      uVar9 = uVar2 >> 0x18;
      if (uVar9 < uVar6) {
        sVar7 = (short)iVar8;
        if (iVar5 == 0) {
          if (sVar7 < 2) {
            if (fSaveCut0 != 0 && sVar7 == 1) goto LAB_0037aa00;
          }
          else if ((pCutSet->ppCuts[1]->field_0x1d & 0x40) != 0) {
LAB_0037aa00:
            iVar5 = 0;
            goto LAB_0037aa02;
          }
        }
        if ((pCut->uSign & ~pIVar3->uSign) == 0) {
          if (uVar6 < uVar9) {
            __assert_fail("pDom->nLeaves <= pCut->nLeaves",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCut.c"
                          ,0x7a,"int If_CutCheckDominance(If_Cut_t *, If_Cut_t *)");
          }
          if (0xffffff < uVar2) {
            uVar11 = 0;
            do {
              uVar12 = 0;
              if (0xffffff < uVar1) {
                uVar12 = 0;
                do {
                  if ((&pCut[1].Area)[uVar11] == (&pIVar3[1].Area)[uVar12]) goto LAB_0037a927;
                  uVar12 = uVar12 + 1;
                } while (uVar6 != uVar12);
                uVar12 = (ulong)uVar6;
              }
LAB_0037a927:
              if ((uint)uVar12 == uVar6) goto LAB_0037aa02;
              uVar11 = uVar11 + 1;
            } while (uVar11 != uVar9);
          }
          if (iVar5 < iVar4) {
            do {
              pCutSet->ppCuts[lVar10] = pCutSet->ppCuts[lVar10 + 1];
              lVar10 = lVar10 + 1;
            } while (iVar4 != lVar10);
          }
          pCutSet->ppCuts[sVar7] = pIVar3;
          iVar8 = iVar8 + -1;
          pCutSet->nCuts = (short)iVar8;
          iVar5 = iVar5 + -1;
        }
      }
      else if ((pIVar3->uSign & ~pCut->uSign) == 0) {
        if (uVar1 < 0x1000000) {
          return 1;
        }
        uVar11 = 0;
        do {
          uVar12 = 0;
          if (0xffffff < uVar2) {
            uVar12 = 0;
            do {
              if ((&pIVar3[1].Area)[uVar11] == (&pCut[1].Area)[uVar12]) goto LAB_0037a9c1;
              uVar12 = uVar12 + 1;
            } while (uVar9 != uVar12);
            uVar12 = (ulong)uVar9;
          }
LAB_0037a9c1:
          if ((uint)uVar12 == uVar9) break;
          uVar11 = uVar11 + 1;
          if (uVar11 == uVar6) {
            return 1;
          }
        } while( true );
      }
LAB_0037aa02:
      iVar5 = iVar5 + 1;
      iVar4 = (int)(short)iVar8;
    } while (iVar5 < iVar4);
  }
  return 0;
}

Assistant:

int If_CutFilter( If_Set_t * pCutSet, If_Cut_t * pCut, int fSaveCut0 )
{ 
    If_Cut_t * pTemp;
    int i, k;
    assert( pCutSet->ppCuts[pCutSet->nCuts] == pCut );
    for ( i = 0; i < pCutSet->nCuts; i++ )
    {
        pTemp = pCutSet->ppCuts[i];
        if ( pTemp->nLeaves > pCut->nLeaves )
        {
            // do not fiter the first cut
            if ( i == 0 && ((pCutSet->nCuts > 1 && pCutSet->ppCuts[1]->fUseless) || (fSaveCut0 && pCutSet->nCuts == 1)) )
                continue;
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
                continue;
            // check containment seriously
            if ( If_CutCheckDominance( pCut, pTemp ) )
            {
//                p->ppCuts[i] = p->ppCuts[p->nCuts-1];
//                p->ppCuts[p->nCuts-1] = pTemp;
//                p->nCuts--;
//                i--;
                // remove contained cut
                for ( k = i; k < pCutSet->nCuts; k++ )
                    pCutSet->ppCuts[k] = pCutSet->ppCuts[k+1];
                pCutSet->ppCuts[pCutSet->nCuts] = pTemp;
                pCutSet->nCuts--;
                i--;
            }
         }
        else
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
                continue;
            // check containment seriously
            if ( If_CutCheckDominance( pTemp, pCut ) )
                return 1;
        }
    }
    return 0;
}